

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall
IteratorTest_TruncatingIterator_Test::TestBody(IteratorTest_TruncatingIterator_Test *this)

{
  undefined1 uVar1;
  bool bVar2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  truncating_iterator<char_*,_std::integral_constant<bool,_false>_> prev;
  truncating_iterator<char_*,_std::integral_constant<bool,_false>_> it;
  char *p;
  char *in_stack_ffffffffffffff08;
  truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *in_stack_ffffffffffffff10;
  AssertionResult *pAVar3;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  char *in_stack_ffffffffffffff20;
  truncating_iterator_base<char_*> *expected_expression;
  int line;
  truncating_iterator_base<char_*> *this_00;
  Type type;
  undefined7 in_stack_ffffffffffffff40;
  AssertionResult local_98 [2];
  Message *in_stack_ffffffffffffff88;
  AssertHelper *in_stack_ffffffffffffff90;
  AssertionResult local_60;
  truncating_iterator_base<char_*> local_50;
  truncating_iterator_base<char_*> local_30;
  undefined8 local_10;
  
  local_10 = 0;
  expected_expression = &local_30;
  fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>::
  truncating_iterator(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,0x12201a);
  this_00 = &local_50;
  fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>::operator++
            (in_stack_ffffffffffffff10,(int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
  fmt::v5::internal::truncating_iterator_base<char_*>::base(this_00);
  pAVar3 = &local_60;
  testing::internal::EqHelper<false>::Compare<char*,char*>
            ((char *)expected_expression,in_stack_ffffffffffffff20,
             (char **)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18),
             (char **)in_stack_ffffffffffffff10);
  uVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar3);
  type = (Type)((ulong)pAVar3 >> 0x20);
  if (!(bool)uVar1) {
    testing::Message::Message((Message *)CONCAT17(uVar1,in_stack_ffffffffffffff40));
    in_stack_ffffffffffffff20 =
         testing::AssertionResult::failure_message((AssertionResult *)0x1220c6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar1,in_stack_ffffffffffffff40),type,(char *)this_00,
               (int)((ulong)expected_expression >> 0x20),in_stack_ffffffffffffff20);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffff10);
    testing::Message::~Message((Message *)0x122114);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x122163);
  fmt::v5::internal::truncating_iterator_base<char_*>::base(&local_30);
  pAVar3 = local_98;
  testing::internal::EqHelper<false>::Compare<char*,char*>
            ((char *)expected_expression,in_stack_ffffffffffffff20,
             (char **)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18),(char **)pAVar3)
  ;
  line = (int)((ulong)expected_expression >> 0x20);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar3);
  if (!bVar2) {
    testing::Message::Message((Message *)CONCAT17(uVar1,in_stack_ffffffffffffff40));
    testing::AssertionResult::failure_message((AssertionResult *)0x12220c);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar1,in_stack_ffffffffffffff40),type,(char *)this_00,line,
               in_stack_ffffffffffffff20);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)pAVar3);
    testing::Message::~Message((Message *)0x122258);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1222a4);
  return;
}

Assistant:

TEST(IteratorTest, TruncatingIterator) {
  char *p = FMT_NULL;
  fmt::internal::truncating_iterator<char*> it(p, 3);
  auto prev = it++;
  EXPECT_EQ(prev.base(), p);
  EXPECT_EQ(it.base(), p + 1);
}